

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_loadhostpairs(SessionHandle *data)

{
  int iVar1;
  Curl_addrinfo *cahead;
  char *__s;
  size_t sVar2;
  size_t entry_len;
  char *entry_id;
  Curl_addrinfo *addr;
  Curl_dns_entry *dns;
  char local_228 [4];
  int port;
  char address [256];
  char hostname [256];
  curl_slist *local_20;
  curl_slist *hostp;
  SessionHandle *data_local;
  
  local_20 = (data->change).resolve;
  do {
    if (local_20 == (curl_slist *)0x0) {
      (data->change).resolve = (curl_slist *)0x0;
      return CURLE_OK;
    }
    if (((local_20->data != (char *)0x0) && (*local_20->data != '-')) &&
       (iVar1 = __isoc99_sscanf(local_20->data,"%255[^:]:%d:%255s",address + 0xf8,(long)&dns + 4,
                                local_228), iVar1 == 3)) {
      cahead = Curl_str2addr(local_228,dns._4_4_);
      if (cahead == (Curl_addrinfo *)0x0) {
        Curl_infof(data,"Resolve %s found illegal!\n",local_20->data);
      }
      else {
        __s = create_hostcache_id(address + 0xf8,dns._4_4_);
        if (__s == (char *)0x0) {
          Curl_freeaddrinfo(cahead);
          return CURLE_OUT_OF_MEMORY;
        }
        sVar2 = strlen(__s);
        if (data->share != (Curl_share *)0x0) {
          Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
        }
        addr = (Curl_addrinfo *)Curl_hash_pick((data->dns).hostcache,__s,sVar2 + 1);
        (*Curl_cfree)(__s);
        if (addr == (Curl_addrinfo *)0x0) {
          addr = (Curl_addrinfo *)Curl_cache_addr(data,cahead,address + 0xf8,dns._4_4_);
        }
        else {
          Curl_freeaddrinfo(cahead);
        }
        if (data->share != (Curl_share *)0x0) {
          Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
        }
        if (addr == (Curl_addrinfo *)0x0) {
          Curl_freeaddrinfo(cahead);
          return CURLE_OUT_OF_MEMORY;
        }
        Curl_infof(data,"Added %s:%d:%s to DNS cache\n",address + 0xf8,(ulong)dns._4_4_,local_228);
      }
    }
    local_20 = local_20->next;
  } while( true );
}

Assistant:

CURLcode Curl_loadhostpairs(struct SessionHandle *data)
{
  struct curl_slist *hostp;
  char hostname[256];
  char address[256];
  int port;

  for(hostp = data->change.resolve; hostp; hostp = hostp->next ) {
    if(!hostp->data)
      continue;
    if(hostp->data[0] == '-') {
      /* TODO: mark an entry for removal */
    }
    else if(3 == sscanf(hostp->data, "%255[^:]:%d:%255s", hostname, &port,
                        address)) {
      struct Curl_dns_entry *dns;
      Curl_addrinfo *addr;
      char *entry_id;
      size_t entry_len;

      addr = Curl_str2addr(address, port);
      if(!addr) {
        infof(data, "Resolve %s found illegal!\n", hostp->data);
        continue;
      }

      /* Create an entry id, based upon the hostname and port */
      entry_id = create_hostcache_id(hostname, port);
      /* If we can't create the entry id, fail */
      if(!entry_id) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }

      entry_len = strlen(entry_id);

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* See if its already in our dns cache */
      dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len+1);

      /* free the allocated entry_id again */
      free(entry_id);

      if(!dns)
        /* if not in the cache already, put this host in the cache */
        dns = Curl_cache_addr(data, addr, hostname, port);
      else
        /* this is a duplicate, free it again */
        Curl_freeaddrinfo(addr);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        Curl_freeaddrinfo(addr);
        return CURLE_OUT_OF_MEMORY;
      }
      infof(data, "Added %s:%d:%s to DNS cache\n",
            hostname, port, address);
    }
  }
  data->change.resolve = NULL; /* dealt with now */

  return CURLE_OK;
}